

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O3

void __thiscall
Js::IntlEngineInterfaceExtensionObject::EnsureIntlByteCode
          (IntlEngineInterfaceExtensionObject *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  HRESULT hr;
  SourceContextInfo *pSVar3;
  SRCINFO *srcInfo;
  undefined4 *puVar4;
  SRCINFO local_58;
  
  if ((this->intlByteCode).ptr == (FunctionBody *)0x0) {
    pSVar3 = ScriptContext::GetSourceContextInfo
                       (scriptContext,0xffffffffffffffff,(SimpleDataCacheWrapper *)0x0);
    if (pSVar3 == (SourceContextInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x2b7,"(sourceContextInfo != nullptr)",
                                  "sourceContextInfo != nullptr");
      if (!bVar2) goto LAB_00b5a835;
      *puVar4 = 0;
      pSVar3 = (SourceContextInfo *)0x0;
    }
    local_58.lnMinHost = 0;
    local_58.ichMinHost = 0;
    local_58.ichLimHost = 0;
    local_58.ulCharOffset = 0;
    local_58.sourceContextInfo.ptr = (SourceContextInfo *)0x0;
    local_58.dlnHost = 0;
    local_58.ulColumnHost = 0;
    local_58.moduleID = 0;
    local_58.grfsi = 0;
    Memory::Recycler::WBSetBit((char *)&local_58);
    local_58.sourceContextInfo.ptr = pSVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_58);
    srcInfo = ScriptContext::AddHostSrcInfo(scriptContext,&local_58);
    hr = ByteCodeSerializer::DeserializeFromBuffer
                   (scriptContext,(DAT_015933a0 | 2) << 0x10,(LPCUTF8)0x0,srcInfo,
                    js::Library_Bytecode_Intl,(NativeModule *)0x0,&this->intlByteCode,0xffffffff);
    if (hr < 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/IntlEngineInterfaceExtensionObject.cpp"
                                  ,0x2c1,"(false)",
                                  "Failed to deserialize Intl.js bytecode - very probably the bytecode needs to be rebuilt."
                                 );
      if (bVar2) {
        *puVar4 = 0;
        JavascriptError::MapAndThrowError(scriptContext,hr);
      }
LAB_00b5a835:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    (this->super_EngineExtensionObjectBase).hasBytecode = true;
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::EnsureIntlByteCode(_In_ ScriptContext * scriptContext)
    {
        if (this->intlByteCode == nullptr)
        {
            SourceContextInfo * sourceContextInfo = scriptContext->GetSourceContextInfo(Js::Constants::NoHostSourceContext, NULL);

            Assert(sourceContextInfo != nullptr);

            SRCINFO si;
            memset(&si, 0, sizeof(si));
            si.sourceContextInfo = sourceContextInfo;
            SRCINFO *hsi = scriptContext->AddHostSrcInfo(&si);
            uint32 flags = fscrIsLibraryCode | (CONFIG_FLAG(CreateFunctionProxy) && !scriptContext->IsProfiling() ? fscrAllowFunctionProxy : 0);

            HRESULT hr = Js::ByteCodeSerializer::DeserializeFromBuffer(scriptContext, flags, (LPCUTF8)nullptr, hsi, (byte*)js::Library_Bytecode_Intl, nullptr, &this->intlByteCode);

            IfFailAssertMsgAndThrowHr(hr, "Failed to deserialize Intl.js bytecode - very probably the bytecode needs to be rebuilt.");

            this->SetHasBytecode();
        }
    }